

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMarkers::ArchiveIN(ChLinkMarkers *this,ChArchiveIn *marchive)

{
  char *local_38;
  int *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMarkers>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_30 = &this->markID1;
  local_38 = "markID1";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = &this->markID2;
  local_38 = "markID2";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMarkers::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMarkers>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(markID1);
    marchive >> CHNVP(markID2);
}